

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

void fiobj_data_dealloc(FIOBJ o,_func_void_FIOBJ_void_ptr *task,void *arg)

{
  void *arg_local;
  _func_void_FIOBJ_void_ptr *task_local;
  FIOBJ o_local;
  
  if (*(int *)(o + 0x30) == -2) {
    fiobj_free(*(FIOBJ *)(o + 0x10));
  }
  else if (*(int *)(o + 0x30) == -1) {
    if ((*(long *)(o + 0x10) != 0) && (*(long *)(o + 8) != 0)) {
      (**(code **)(o + 0x10))(*(undefined8 *)(o + 8));
    }
  }
  else {
    close(*(int *)(o + 0x30));
    fio_free(*(void **)(o + 8));
  }
  fio_free((void *)o);
  return;
}

Assistant:

static void fiobj_data_dealloc(FIOBJ o, void (*task)(FIOBJ, void *),
                               void *arg) {
  switch (obj2io(o)->fd) {
  case -1:
    if (obj2io(o)->source.dealloc && obj2io(o)->buffer)
      obj2io(o)->source.dealloc(obj2io(o)->buffer);
    break;
  case -2:
    fiobj_free(obj2io(o)->source.parent);
    break;
  default:
    close(obj2io(o)->fd);
    fio_free(obj2io(o)->buffer);
    break;
  }
  fio_free((void *)o);
  (void)task;
  (void)arg;
}